

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

string * __thiscall
Node::OutputArrayParam_abi_cxx11_(string *__return_storage_ptr__,Node *this,int Increment)

{
  char *pcVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  char buffer [16];
  string local_68;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->Type == 0x1f5) {
    if (this->Tree[0] == (Node *)0x0) {
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x12dc36);
    }
    else {
      OutputArrayParam_abi_cxx11_(&local_68,this->Tree[0],Increment);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (this->Tree[1] == (Node *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    OutputArrayParam_abi_cxx11_(&local_68,this->Tree[1],Increment);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p)
    ;
  }
  else {
    if (Increment == 1) {
      iVar2 = IsSimpleInteger(this);
      if (iVar2 != 0) {
        iVar2 = atoi((this->TextValue)._M_dataplus._M_p);
        sprintf((char *)&local_68,"%d",(ulong)(iVar2 + 1));
        pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
        strlen((char *)&local_68);
        std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)&local_68);
        return __return_storage_ptr__;
      }
      OutputForcedType_abi_cxx11_(&local_48,this,VARTYPE_INTEGER);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_68.field_2._M_allocated_capacity = *psVar4;
        local_68.field_2._8_8_ = plVar3[3];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar4;
        local_68._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_68._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0011dc83;
    }
    OutputForcedType_abi_cxx11_(&local_68,this,VARTYPE_INTEGER);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
  }
  local_48.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
  local_48._M_dataplus._M_p = local_68._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    return __return_storage_ptr__;
  }
LAB_0011dc83:
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputArrayParam(
	int Increment	/**< Increment */
)
{
	std::string result;

	switch(Type)
	{
	case BAS_N_LIST:

		if (Tree[0] != 0)
		{
			result = Tree[0]->OutputArrayParam(Increment);
		}
		else
		{
			result = "(NULL)";
		}
		result += "][";
		if (Tree[1] != 0)
		{
			result += Tree[1]->OutputArrayParam(Increment);
		}
		else
		{
			result += "(NULL)";
		}
		break;

	default:

		if (Increment == 1)
		{
			if (IsSimpleInteger())
			{
				// FIXME: There really ought to be a better way
				char buffer[16];
				sprintf(buffer, "%d", atoi(TextValue.c_str()) + 1);
				result = buffer;
			}
			else
			{
				result = OutputForcedType(VARTYPE_INTEGER) + " + 1";
			}
		}
		else
		{
			result = OutputForcedType(VARTYPE_INTEGER);
		}
		break;

	}
	return result;
}